

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Boost::render(V2Boost *this,StereoSample *buf,int nsamples)

{
  float fVar1;
  float fVar2;
  float y;
  float x;
  int i;
  float ym2;
  float ym1;
  float xm2;
  float xm1;
  int ch;
  int nsamples_local;
  StereoSample *buf_local;
  V2Boost *this_local;
  
  if ((this->enabled & 1U) != 0) {
    for (xm2 = 0.0; (int)xm2 < 2; xm2 = (float)((int)xm2 + 1)) {
      ym2 = this->x2[(int)xm2];
      x = this->y2[(int)xm2];
      i = (int)this->y1[(int)xm2];
      ym1 = this->x1[(int)xm2];
      for (y = 0.0; (int)y < nsamples; y = (float)((int)y + 1)) {
        fVar1 = buf->ch[(long)(int)y * 2 + (long)(int)xm2];
        fVar2 = -this->a2 * x +
                -this->a1 * (float)i +
                this->b2 * ym2 + this->b0 * (fVar1 + 3.8146973e-06) + this->b1 * ym1;
        x = (float)i;
        ym2 = ym1;
        buf->ch[(long)(int)y * 2 + (long)(int)xm2] = fVar2;
        i = (int)fVar2;
        ym1 = fVar1 + 3.8146973e-06;
      }
      this->x1[(int)xm2] = ym1;
      this->x2[(int)xm2] = ym2;
      this->y1[(int)xm2] = (float)i;
      this->y2[(int)xm2] = x;
    }
  }
  return;
}

Assistant:

void render(StereoSample *buf, int nsamples)
    {
        if (!enabled)
            return;

        COVER("BOOST render");

        for (int ch=0; ch < 2; ch++)
        {
            float xm1 = x1[ch], xm2 = x2[ch];
            float ym1 = y1[ch], ym2 = y2[ch];

            for (int i=0; i < nsamples; i++)
            {
                float x = buf[i].ch[ch] + fcdcoffset;

                // Second-order IIR filter
                float y = b0*x + b1*xm1 + b2*xm2 - a1*ym1 - a2*ym2;
                ym2 = ym1; ym1 = y;
                xm2 = xm1; xm1 = x;

                buf[i].ch[ch] = y;
            }

            x1[ch] = xm1; x2[ch] = xm2;
            y1[ch] = ym1; y2[ch] = ym2;
        }
    }